

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_splitNoTokenOnTheEnd_Test::~TEST_SimpleString_splitNoTokenOnTheEnd_Test
          (TEST_SimpleString_splitNoTokenOnTheEnd_Test *this)

{
  TEST_SimpleString_splitNoTokenOnTheEnd_Test *this_local;
  
  ~TEST_SimpleString_splitNoTokenOnTheEnd_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, splitNoTokenOnTheEnd)
{
    SimpleString string("Bah Yah oops");
    SimpleStringCollection collection;

    string.split(" ", collection);
    LONGS_EQUAL(3, collection.size());
    STRCMP_EQUAL("Bah ", collection[0].asCharString());
    STRCMP_EQUAL("Yah ", collection[1].asCharString());
    STRCMP_EQUAL("oops", collection[2].asCharString());
}